

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O0

void __thiscall
sglr::Context::readPixels(Context *this,Surface *dst,int x,int y,int width,int height)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  PixelBufferAccess local_50;
  uint local_28;
  uint local_24;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Surface *dst_local;
  Context *this_local;
  
  local_28 = height;
  local_24 = width;
  height_local = y;
  width_local = x;
  _y_local = dst;
  dst_local = (Surface *)this;
  tcu::Surface::setSize(dst,width,height);
  iVar4 = width_local;
  iVar3 = height_local;
  uVar2 = local_24;
  uVar1 = local_28;
  tcu::Surface::getAccess(&local_50,_y_local);
  pvVar5 = tcu::PixelBufferAccess::getDataPtr(&local_50);
  (*this->_vptr_Context[0x78])
            (this,(ulong)(uint)iVar4,(ulong)(uint)iVar3,(ulong)uVar2,(ulong)uVar1,0x1908,0x1401,
             pvVar5);
  return;
}

Assistant:

void Context::readPixels (tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	readPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}